

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O2

int __thiscall helics::tcp::TcpComms::processIncomingMessage(TcpComms *this,ActionMessage *cmd)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = isProtocolCommand(cmd);
  if ((bVar1) && (cmd->messageID == 0x16570bf)) {
    iVar2 = -1;
  }
  else {
    std::function<void_(helics::ActionMessage_&&)>::operator()
              (&(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback,cmd);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int TcpComms::processIncomingMessage(ActionMessage&& cmd)
{
    if (isProtocolCommand(cmd)) {
        switch (cmd.messageID) {
            case CLOSE_RECEIVER:
                return (-1);
            default:
                break;
        }
    }
    ActionCallback(std::move(cmd));
    return 0;
}